

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::clear
          (SmallVectorBase<slang::analysis::DataFlowState> *this)

{
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<slang::analysis::DataFlowState>_&>
            ((__destroy_fn *)&std::ranges::destroy,this);
  this->len = 0;
  return;
}

Assistant:

void clear() noexcept {
        std::ranges::destroy(*this);
        len = 0;
    }